

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrgba64_p.h
# Opt level: O0

QRgba64 interpolate255(QRgba64 x,uint alpha1,QRgba64 y,uint alpha2)

{
  long lVar1;
  __m128i y_00;
  undefined1 auVar2 [16];
  longlong in_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  __m128i vr;
  __m128i vy;
  __m128i vx;
  QRgba64 r;
  ulong in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_stack_ffffffffffffff78;
  y_00[1] = in_RDX;
  y_00[0] = (longlong)&DAT_aaaaaaaaaaaaaaaa;
  interpolate255((__m128i)(auVar2 << 0x40),(uint)((ulong)in_RDI >> 0x20),y_00,0xaaaaaaaa);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QRgba64)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  }
  __stack_chk_fail();
}

Assistant:

static inline QRgba64 interpolate255(QRgba64 x, uint alpha1, QRgba64 y, uint alpha2)
{
#if defined(__SSE2__)
    const __m128i vx = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(&x));
    const __m128i vy = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(&y));
    const __m128i vr = interpolate255(vx, alpha1, vy, alpha2);
    QRgba64 r;
    _mm_storel_epi64(reinterpret_cast<__m128i *>(&r), vr);
    return r;
#elif defined(__ARM_NEON__)
    const uint16x4_t vx = vreinterpret_u16_u64(vld1_u64(reinterpret_cast<const uint64_t *>(&x)));
    const uint16x4_t vy = vreinterpret_u16_u64(vld1_u64(reinterpret_cast<const uint64_t *>(&y)));
    const uint16x4_t vr = interpolate255(vx, alpha1, vy, alpha2);
    QRgba64 r;
    vst1_u64(reinterpret_cast<uint64_t *>(&r), vreinterpret_u64_u16(vr));
    return r;
#elif defined(__loongarch_sx)
    const __m128i vx = __lsx_vldrepl_d(reinterpret_cast<const __m128i *>(&x), 0);
    const __m128i vy = __lsx_vldrepl_d(reinterpret_cast<const __m128i *>(&y), 0);
    const __m128i vr = interpolate255(vx, alpha1, vy, alpha2);
    QRgba64 r;
    __lsx_vstelm_d(vr, reinterpret_cast<__m128i *>(&r), 0, 0);
    return r;
#else
    return QRgba64::fromRgba64(multiplyAlpha255(x, alpha1) + multiplyAlpha255(y, alpha2));
#endif
}